

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

Variable __thiscall
LiteScript::_Type_CHARACTER::OAddAndAssign(_Type_CHARACTER *this,Variable *obj1,Variable *obj2)

{
  bool bVar1;
  Object *pOVar2;
  Type *pTVar3;
  String *pSVar4;
  Character *pCVar5;
  Variable *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *puVar6;
  Variable VVar7;
  String local_68;
  undefined4 local_48;
  undefined1 local_38 [8];
  Variable tmp;
  Variable *obj2_local;
  Variable *obj1_local;
  _Type_CHARACTER *this_local;
  
  tmp.nb_ref = (uint *)in_RCX;
  pOVar2 = Variable::operator->(in_RCX);
  pTVar3 = Object::GetType(pOVar2);
  bVar1 = Type::operator!=(pTVar3,(Type *)_type_string);
  if (bVar1) {
    Variable::Convert((Variable *)local_38,(Type *)tmp.nb_ref);
    pOVar2 = Variable::operator->((Variable *)local_38);
    pTVar3 = Object::GetType(pOVar2);
    bVar1 = Type::operator==(pTVar3,(Type *)_type_string);
    if (bVar1) {
      pOVar2 = Variable::operator->((Variable *)local_38);
      pSVar4 = Object::GetData<LiteScript::String>(pOVar2);
      pOVar2 = Variable::operator->(obj2);
      pCVar5 = Object::GetData<LiteScript::Character>(pOVar2);
      Character::operator+=(pCVar5,pSVar4);
      Variable::Variable((Variable *)this,obj2);
    }
    else {
      String::String(&local_68,"");
      pOVar2 = Variable::operator->(obj2);
      pCVar5 = Object::GetData<LiteScript::Character>(pOVar2);
      Character::operator+=(pCVar5,&local_68);
      String::~String(&local_68);
      Variable::Variable((Variable *)this,obj2);
    }
    local_48 = 1;
    Variable::~Variable((Variable *)local_38);
    puVar6 = extraout_RDX;
  }
  else {
    pOVar2 = Variable::operator->((Variable *)tmp.nb_ref);
    pSVar4 = Object::GetData<LiteScript::String>(pOVar2);
    pOVar2 = Variable::operator->(obj2);
    pCVar5 = Object::GetData<LiteScript::Character>(pOVar2);
    Character::operator+=(pCVar5,pSVar4);
    Variable::Variable((Variable *)this,obj2);
    puVar6 = extraout_RDX_00;
  }
  VVar7.nb_ref = puVar6;
  VVar7.obj = (Object *)this;
  return VVar7;
}

Assistant:

LiteScript::Variable LiteScript::_Type_CHARACTER::OAddAndAssign(LiteScript::Variable& obj1, const LiteScript::Variable& obj2) const {
    if (obj2->GetType() != Type::STRING) {
        Variable tmp = obj2.Convert(Type::STRING);
        if (tmp->GetType() == Type::STRING) {
            obj1->GetData<Character>() += tmp->GetData<String>();
            return obj1;
        }
        obj1->GetData<Character>() += String("");
        return obj1;
    }
    obj1->GetData<Character>() += obj2->GetData<String>();
    return obj1;
}